

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  SUNErrCode SVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar4 = B->content;
  if (iVar2 == *(int *)((long)pvVar4 + 0x28)) {
    SVar13 = SUNMatCopy_Sparse(A,B);
    return SVar13;
  }
  lVar18 = *(long *)((long)pvVar3 + 0x38);
  lVar5 = *(long *)((long)pvVar3 + 0x20);
  lVar6 = *(long *)((long)pvVar3 + 0x30);
  lVar20 = *(long *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
  lVar7 = *(long *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
  lVar8 = *(long *)((long)pvVar4 + 0x38);
  lVar9 = *(long *)((long)pvVar4 + 0x20);
  lVar10 = *(long *)((long)pvVar4 + 0x30);
  lVar16 = *(long *)(lVar18 + lVar20 * 8);
  SUNMatZero_Sparse(B);
  lVar14 = 0;
  lVar15 = 0;
  if (0 < lVar16) {
    lVar15 = lVar16;
  }
  for (; lVar15 != lVar14; lVar14 = lVar14 + 1) {
    plVar1 = (long *)(lVar8 + *(long *)(lVar6 + lVar14 * 8) * 8);
    *plVar1 = *plVar1 + 1;
  }
  lVar15 = 0;
  if (0 < lVar7) {
    lVar15 = lVar7;
  }
  lVar14 = 0;
  for (lVar19 = 0; lVar15 != lVar19; lVar19 = lVar19 + 1) {
    lVar11 = *(long *)(lVar8 + lVar19 * 8);
    *(long *)(lVar8 + lVar19 * 8) = lVar14;
    lVar14 = lVar11 + lVar14;
  }
  *(long *)(lVar8 + lVar7 * 8) = lVar16;
  lVar16 = 0;
  if (lVar20 < 1) {
    lVar20 = lVar16;
  }
  while (lVar15 = lVar16, lVar15 != lVar20) {
    for (lVar14 = *(long *)(lVar18 + lVar15 * 8); lVar16 = lVar15 + 1,
        lVar14 < *(long *)(lVar18 + (lVar15 + 1) * 8); lVar14 = lVar14 + 1) {
      lVar16 = *(long *)(lVar6 + lVar14 * 8);
      lVar19 = *(long *)(lVar8 + lVar16 * 8);
      *(long *)(lVar10 + lVar19 * 8) = lVar15;
      *(undefined8 *)(lVar9 + lVar19 * 8) = *(undefined8 *)(lVar5 + lVar14 * 8);
      plVar1 = (long *)(lVar8 + lVar16 * 8);
      *plVar1 = *plVar1 + 1;
    }
  }
  uVar17 = 0;
  for (lVar18 = 0; lVar18 <= lVar7; lVar18 = lVar18 + 1) {
    uVar12 = *(undefined8 *)(lVar8 + lVar18 * 8);
    *(undefined8 *)(lVar8 + lVar18 * 8) = uVar17;
    uVar17 = uVar12;
  }
  return (SUNErrCode)uVar17;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}